

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidyRemoveAnchorByNode(TidyDocImpl *doc,ctmbstr name,Node *node)

{
  Anchor *pAVar1;
  int iVar2;
  uint uVar3;
  Anchor *pAVar4;
  char cVar5;
  Anchor *pAVar6;
  char *pcVar7;
  Anchor *pAVar8;
  
  iVar2 = prvTidyHTMLVersion(doc);
  if (iVar2 == 0x20000) {
    uVar3 = 0;
    if ((name != (ctmbstr)0x0) && (cVar5 = *name, cVar5 != '\0')) {
      pcVar7 = name + 1;
      uVar3 = 0;
      do {
        uVar3 = uVar3 * 0x1f + (int)cVar5;
        cVar5 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar5 != '\0');
      uVar3 = uVar3 % 0x3fd;
    }
  }
  else {
    uVar3 = anchorNameHash(name);
  }
  pAVar4 = (Anchor *)((doc->attribs).anchor_hash + uVar3);
  pAVar1 = (Anchor *)0x0;
  pAVar8 = pAVar4;
  do {
    pAVar6 = pAVar1;
    pAVar8 = pAVar8->next;
    if (pAVar8 == (Anchor *)0x0) goto LAB_00127395;
    pAVar1 = pAVar8;
  } while (pAVar8->node != node);
  if (pAVar6 != (Anchor *)0x0) {
    pAVar4 = pAVar6;
  }
  pAVar4->next = pAVar8->next;
  (*doc->allocator->vtbl->free)(doc->allocator,pAVar8->name);
LAB_00127395:
  (*doc->allocator->vtbl->free)(doc->allocator,pAVar8);
  return;
}

Assistant:

void TY_(RemoveAnchorByNode)( TidyDocImpl* doc, ctmbstr name, Node *node )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *delme = NULL, *curr, *prev = NULL;
    uint h;
    if (TY_(HTMLVersion)(doc) == HT50)
        h = anchorNameHash5(name);
    else
        h = anchorNameHash(name);

    for ( curr=attribs->anchor_hash[h]; curr!=NULL; curr=curr->next )
    {
        if ( curr->node == node )
        {
            if ( prev )
                prev->next = curr->next;
            else
                attribs->anchor_hash[h] = curr->next;
            delme = curr;
            break;
        }
        prev = curr;
    }
    FreeAnchor( doc, delme );
}